

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadEqn.c
# Opt level: O1

void Io_ReadEqnStrCutAt(char *pStr,char *pStop,int fUniqueOnly,Vec_Ptr_t *vTokens)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  vTokens->nSize = 0;
  __s2 = strtok(pStr,pStop);
  do {
    if (__s2 == (char *)0x0) {
      return;
    }
    if ((fUniqueOnly != 0) && (iVar5 = vTokens->nSize, 0 < (long)iVar5)) {
      ppvVar3 = vTokens->pArray;
      lVar4 = 0;
      do {
        iVar2 = strcmp((char *)ppvVar3[lVar4],__s2);
        if (iVar2 == 0) goto LAB_00884a7e;
        lVar4 = lVar4 + 1;
      } while (iVar5 != lVar4);
    }
    uVar1 = vTokens->nCap;
    if (vTokens->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (vTokens->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vTokens->pArray,0x80);
        }
        vTokens->pArray = ppvVar3;
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar1 * 2;
        if (iVar5 <= (int)uVar1) goto LAB_00884a6c;
        if (vTokens->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vTokens->pArray,(ulong)uVar1 << 4);
        }
        vTokens->pArray = ppvVar3;
      }
      vTokens->nCap = iVar5;
    }
LAB_00884a6c:
    iVar5 = vTokens->nSize;
    vTokens->nSize = iVar5 + 1;
    vTokens->pArray[iVar5] = __s2;
LAB_00884a7e:
    __s2 = strtok((char *)0x0,pStop);
  } while( true );
}

Assistant:

void Io_ReadEqnStrCutAt( char * pStr, char * pStop, int fUniqueOnly, Vec_Ptr_t * vTokens )
{
    char * pToken;
    Vec_PtrClear( vTokens );
    for ( pToken = strtok( pStr, pStop ); pToken; pToken = strtok( NULL, pStop ) )
        if ( !fUniqueOnly || Io_ReadEqnStrFind( vTokens, pToken ) == -1 )
            Vec_PtrPush( vTokens, pToken );
}